

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,Belief *belief,History *history,int hstart)

{
  pointer *pppSVar1;
  DSPOMDP *pDVar2;
  iterator __position;
  pointer ppSVar3;
  bool bVar4;
  double dVar5;
  State *pSVar6;
  Belief *pBVar7;
  uint uVar8;
  int iVar9;
  pointer ppSVar10;
  log_ostream *plVar11;
  ostream *poVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar21;
  double dVar22;
  State *particle;
  OBS_TYPE obs;
  double reward;
  State *local_d0;
  long local_b8;
  double local_b0;
  double local_a0;
  State *local_98;
  ulong uStack_90;
  long local_88;
  ulong local_78;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  Belief *local_50;
  double local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0 = -INFINITY;
  uVar13 = 0;
  if (num < 1) {
    local_b8 = 0;
    local_d0 = (State *)0x0;
    uVar18 = 0;
  }
  else {
    local_6c = num * 200;
    local_60 = (ulong)hstart;
    local_48 = 1.0 / (double)num;
    iVar9 = 0;
    iVar15 = 0;
    local_d0 = (State *)0x0;
    local_78 = 0;
    local_b8 = 0;
    local_50 = belief;
    do {
      pBVar7 = local_50;
      local_64 = iVar9;
      local_58 = uVar13;
      if ((long)(local_78 - (long)local_d0) >> 3 == (long)iVar15) {
        (*local_50->_vptr_Belief[2])(&local_98);
        lVar14 = local_88;
        pSVar6 = local_98;
        local_78 = uStack_90;
        local_98 = (State *)0x0;
        uStack_90 = 0;
        local_88 = 0;
        if (local_d0 != (State *)0x0) {
          operator_delete(local_d0,local_b8 - (long)local_d0);
        }
        if (local_98 != (State *)0x0) {
          operator_delete(local_98,local_88 - (long)local_98);
        }
        iVar15 = 0;
        local_b8 = lVar14;
        local_d0 = pSVar6;
      }
      local_98 = (State *)(&local_d0->_vptr_State)[iVar15];
      local_b0 = 0.0;
      local_68 = iVar15;
      if (local_60 <
          (ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        local_b0 = 0.0;
        uVar13 = local_60;
        do {
          pSVar6 = local_98;
          pDVar2 = pBVar7->model_;
          dVar22 = Random::NextDouble((Random *)&Random::RANDOM);
          (*pDVar2->_vptr_DSPOMDP[2])
                    (SUB84(dVar22,0),pDVar2,pSVar6,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar13],local_38,local_40
                    );
          (*pBVar7->model_->_vptr_DSPOMDP[7])
                    (pBVar7->model_,
                     (history->observations_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13],local_98,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar13]);
          if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0 ||
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 0.0) {
            (*pBVar7->model_->_vptr_DSPOMDP[0x17])(pBVar7->model_,local_98);
          }
          else {
            dVar22 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            local_b0 = local_b0 + dVar22;
          }
        } while ((0.0 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
                  (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) &&
                (uVar13 = uVar13 + 1,
                uVar13 < (ulong)((long)(history->actions_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(history->actions_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2)));
      }
      uVar13 = local_58;
      if ((local_98->super_MemoryObject).allocated_ == true) {
        local_98->weight = local_b0;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__
                     ,__position,&local_98);
        }
        else {
          *__position._M_current = local_98;
          pppSVar1 = &(__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        uVar20 = SUB84(local_a0,0);
        uVar21 = (undefined4)((ulong)local_a0 >> 0x20);
        if (local_a0 <= local_b0) {
          uVar20 = SUB84(local_b0,0);
          uVar21 = (undefined4)((ulong)local_b0 >> 0x20);
        }
        local_a0 = (double)CONCAT44(uVar21,uVar20);
        uVar13 = (ulong)((int)uVar13 + 1);
      }
      if (((int)uVar13 == num) &&
         (uVar8 = (int)((ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1,
         -1 < (int)uVar8)) {
        uVar18 = (ulong)uVar8;
        uVar19 = uVar18 * 8 ^ 0xfffffffffffffff8;
        lVar14 = uVar18 * 8 + 8;
        lVar16 = uVar18 + 1;
        do {
          dVar22 = (__return_storage_ptr__->
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar16 + -1]->weight;
          dVar5 = log(local_48);
          if (dVar22 - local_a0 < dVar5) {
            (*local_50->model_->_vptr_DSPOMDP[0x17])
                      (local_50->model_,
                       (__return_storage_ptr__->
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[lVar16 + -1]);
            ppSVar10 = (__return_storage_ptr__->
                       super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            ppSVar3 = (__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            if ((pointer)((long)ppSVar10 + lVar14) != ppSVar3) {
              memmove(ppSVar10 + lVar16 + -1,ppSVar10 + lVar16,
                      (long)ppSVar3 + (uVar19 - (long)ppSVar10));
            }
            pppSVar1 = &(__return_storage_ptr__->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + -1;
            uVar13 = (ulong)((int)uVar13 - 1);
          }
          uVar19 = uVar19 + 8;
          lVar14 = lVar14 + -8;
          lVar17 = lVar16 + -1;
          bVar4 = 0 < lVar16;
          lVar16 = lVar17;
        } while (lVar17 != 0 && bVar4);
      }
      iVar9 = local_64 + 1;
      iVar15 = local_68 + 1;
    } while (((int)uVar13 < num) || (iVar9 < local_6c));
    uVar18 = (ulong)iVar15;
    uVar13 = local_78;
    belief = local_50;
  }
  for (; uVar18 < (ulong)((long)(uVar13 - (long)local_d0) >> 3); uVar18 = uVar18 + 1) {
    (*belief->model_->_vptr_DSPOMDP[0x17])(belief->model_,(&local_d0->_vptr_State)[uVar18]);
  }
  ppSVar10 = (__return_storage_ptr__->
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppSVar10) {
    uVar13 = 0;
    dVar22 = 0.0;
  }
  else {
    dVar22 = 0.0;
    uVar18 = 0;
    do {
      dVar5 = exp(ppSVar10[uVar18]->weight - local_a0);
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar18]->weight = dVar5;
      dVar22 = dVar22 + dVar5;
      uVar18 = uVar18 + 1;
      ppSVar10 = (__return_storage_ptr__->
                 super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      uVar13 = (long)(__return_storage_ptr__->
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppSVar10 >> 3;
    } while (uVar18 < uVar13);
  }
  if (uVar13 != 0) {
    uVar18 = 0;
    do {
      ppSVar10[uVar18]->weight = ppSVar10[uVar18]->weight / dVar22;
      uVar18 = uVar18 + 1;
    } while (uVar13 != uVar18);
  }
  iVar9 = logging::level();
  if ((0 < iVar9) && (iVar9 = logging::level(), 3 < iVar9)) {
    plVar11 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar11->super_ostream,"[Belief::Resample] Resampled ",0x1d);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)plVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," particles",10);
    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar13 = 0;
    do {
      iVar9 = logging::level();
      if ((0 < iVar9) && (iVar9 = logging::level(), 4 < iVar9)) {
        plVar11 = logging::stream(5);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar11->super_ostream," ",1);
        poVar12 = (ostream *)std::ostream::operator<<(plVar11,(int)uVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," = ",3);
        poVar12 = despot::operator<<(poVar12,(__return_storage_ptr__->
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar13]);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_d0 != (State *)0x0) {
    operator_delete(local_d0,local_b8 - (long)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const Belief& belief, History history,
	int hstart) {
	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	int pos = 0;
	double max_wgt = Globals::NEG_INFTY;
	vector<State*> particles;
	int trial = 0;
	while (count < num || trial < 200 * num) {
		// Pick next particle
		if (pos == particles.size()) {
			particles = belief.Sample(num);
			pos = 0;
		}
		State* particle = particles[pos];

		trial++;

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			belief.model_->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = belief.model_->ObsProb(history.Observation(i),
				*particle, history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				belief.model_->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
			count++;
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--) {
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					belief.model_->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
			}
		}

		pos++;
	}

	// Free unused particles
	for (int i = pos; i < particles.size(); i++)
		belief.model_->Free(particles[i]);

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}